

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kpagent.c
# Opt level: O2

kp_error_t kp_agent_send(kp_agent *agent,kp_agent_msg_type type,void *data,size_t size)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = imsg_compose(&agent->ibuf,type,1,0,-1,data,(u_int16_t)size);
  if (iVar1 < 0) {
    uVar2 = 5;
  }
  else {
    iVar1 = imsg_flush(&agent->ibuf);
    uVar2 = iVar1 >> 0x1f & 5;
  }
  return uVar2;
}

Assistant:

kp_error_t
kp_agent_send(struct kp_agent *agent, enum kp_agent_msg_type type, void *data,
              size_t size)
{
	assert(agent);

	if (imsg_compose(&agent->ibuf, type, 1, 0, -1, data, size) < 0) {
		return KP_ERRNO;
	}
	if (imsg_flush(&agent->ibuf) < 0) {
		return KP_ERRNO;
	}

	return KP_SUCCESS;
}